

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::RegisterFileLevelMetadata(DescriptorTable *table)

{
  int iVar1;
  Metadata *pMVar2;
  long lVar3;
  DescriptorTable *local_30;
  bool local_21;
  
  local_21 = table->is_eager;
  local_30 = table;
  std::
  call_once<void(&)(google::protobuf::internal::DescriptorTable_const*,bool),google::protobuf::internal::DescriptorTable_const*&,bool&>
            (table->once,protobuf::anon_unknown_0::AssignDescriptorsImpl,&local_30,&local_21);
  iVar1 = table->num_messages;
  if (0 < (long)iVar1) {
    pMVar2 = table->file_level_metadata;
    lVar3 = 0;
    do {
      MessageFactory::InternalRegisterGeneratedMessage
                (*(Descriptor **)((long)&pMVar2->descriptor + lVar3),
                 *(Message **)(*(long *)((long)&pMVar2->reflection + lVar3) + 8));
      lVar3 = lVar3 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar3);
  }
  return;
}

Assistant:

void RegisterFileLevelMetadata(const DescriptorTable* table) {
  AssignDescriptors(table);
  RegisterAllTypesInternal(table->file_level_metadata, table->num_messages);
}